

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O0

int get_coeff_cost_general
              (int is_last,int ci,tran_low_t abs_qc,int sign,int coeff_ctx,int dc_sign_ctx,
              LV_MAP_COEFF_COST *txb_costs,int bhl,TX_CLASS tx_class,uint8_t *levels)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  byte in_stack_00000018;
  int br_ctx;
  int cost;
  int row;
  int col;
  int mag;
  int pos;
  int stride;
  int row_1;
  int col_1;
  uint in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  long in_stack_ffffffffffffff80;
  int local_74;
  int local_64;
  
  if (in_EDI == 0) {
    in_stack_ffffffffffffff80 = in_stack_00000008 + 0x98 + (long)in_R8D * 0x20;
    in_stack_ffffffffffffff7c = in_EDX;
    if (2 < in_EDX) {
      in_stack_ffffffffffffff7c = 3;
    }
    local_64 = *(int *)(in_stack_ffffffffffffff80 + (long)in_stack_ffffffffffffff7c * 4);
  }
  else {
    local_74 = in_EDX;
    if (2 < in_EDX) {
      local_74 = 3;
    }
    local_64 = *(int *)(in_stack_00000008 + 0x68 + (long)in_R8D * 0xc + (long)(local_74 + -1) * 4);
  }
  if (in_EDX != 0) {
    if (in_ESI == 0) {
      local_64 = *(int *)(in_stack_00000008 + 0x620 + (long)in_R9D * 8 + (long)in_ECX * 4) +
                 local_64;
    }
    else {
      local_64 = local_64 + 0x200;
    }
    if (2 < in_EDX) {
      if (in_EDI == 0) {
        in_stack_ffffffffffffff78 = (uint)in_stack_00000018;
      }
      iVar1 = get_br_cost((tran_low_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                          (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      local_64 = iVar1 + local_64;
    }
  }
  return local_64;
}

Assistant:

static inline int get_coeff_cost_general(int is_last, int ci, tran_low_t abs_qc,
                                         int sign, int coeff_ctx,
                                         int dc_sign_ctx,
                                         const LV_MAP_COEFF_COST *txb_costs,
                                         int bhl, TX_CLASS tx_class,
                                         const uint8_t *levels) {
  int cost = 0;
  if (is_last) {
    cost += txb_costs->base_eob_cost[coeff_ctx][AOMMIN(abs_qc, 3) - 1];
  } else {
    cost += txb_costs->base_cost[coeff_ctx][AOMMIN(abs_qc, 3)];
  }
  if (abs_qc != 0) {
    if (ci == 0) {
      cost += txb_costs->dc_sign_cost[dc_sign_ctx][sign];
    } else {
      cost += av1_cost_literal(1);
    }
    if (abs_qc > NUM_BASE_LEVELS) {
      int br_ctx;
      if (is_last)
        br_ctx = get_br_ctx_eob(ci, bhl, tx_class);
      else
        br_ctx = get_br_ctx(levels, ci, bhl, tx_class);
      cost += get_br_cost(abs_qc, txb_costs->lps_cost[br_ctx]);
    }
  }
  return cost;
}